

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O0

int fe_process_utt(fe_t *fe,int16 *spch,size_t nsamps,mfcc_t ***cep_block,int32 *nframes)

{
  int iVar1;
  mfcc_t **ppmStack_38;
  int rv;
  mfcc_t **cep;
  int32 *nframes_local;
  mfcc_t ***cep_block_local;
  size_t nsamps_local;
  int16 *spch_local;
  fe_t *fe_local;
  
  cep_block_local = (mfcc_t ***)nsamps;
  nsamps_local = (size_t)spch;
  spch_local = (int16 *)fe;
  fe_process_frames_int16(fe,(int16 **)0x0,(size_t *)&cep_block_local,(mfcc_t **)0x0,nframes);
  if (*nframes == 0) {
    ppmStack_38 = (mfcc_t **)
                  __ckd_calloc_2d__(1,(ulong)*(byte *)((long)spch_local + 0x1d),4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                    ,0x208);
  }
  else {
    ppmStack_38 = (mfcc_t **)
                  __ckd_calloc_2d__((long)*nframes,(ulong)*(byte *)((long)spch_local + 0x1d),4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                    ,0x206);
  }
  iVar1 = fe_process_frames_int16
                    ((fe_t *)spch_local,(int16 **)&nsamps_local,(size_t *)&cep_block_local,
                     ppmStack_38,nframes);
  *cep_block = ppmStack_38;
  return iVar1;
}

Assistant:

int
fe_process_utt(fe_t * fe, int16 const * spch, size_t nsamps,
               mfcc_t *** cep_block, int32 * nframes)
{
    mfcc_t **cep;
    int rv;

    /* Figure out how many frames we will need. */
    fe_process_frames_int16(fe, NULL, &nsamps, NULL, nframes);
    /* Create the output buffer (it has to exist, even if there are no output frames). */
    if (*nframes)
        cep = (mfcc_t **)ckd_calloc_2d(*nframes, fe->feature_dimension, sizeof(**cep));
    else
        cep = (mfcc_t **)ckd_calloc_2d(1, fe->feature_dimension, sizeof(**cep));
    /* Now just call fe_process_frames() with the allocated buffer. */
    rv = fe_process_frames_int16(fe, &spch, &nsamps, cep, nframes);
    *cep_block = cep;

    return rv;
}